

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::snedecor_f_dist<long_double>::cdf(snedecor_f_dist<long_double> *this,result_type_conflict3 x)

{
  result_type_conflict3 *prVar1;
  char *in_RCX;
  int extraout_EDX;
  void *in_RSI;
  param_type *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 unaff_retaddr;
  undefined2 in_stack_00000008;
  undefined2 in_stack_00000010;
  undefined8 in_stack_00000012;
  result_type_conflict3 m;
  result_type_conflict3 n;
  undefined2 uVar2;
  undefined6 in_stack_fffffffffffffff2;
  undefined2 uVar3;
  
  uVar3 = SUB82(in_RDI,0);
  uVar2 = in_stack_00000010;
  param_type::n(in_RDI);
  param_type::m(in_RDI,in_RSI,extraout_EDX,in_RCX,in_R8D,in_R9D);
  prVar1 = (result_type_conflict3 *)
           math::Beta_I((longdouble)CONCAT82(in_stack_00000012,in_stack_00000010),
                        (longdouble)CONCAT28(in_stack_00000008,unaff_retaddr),
                        (longdouble)CONCAT28(uVar3,CONCAT62(in_stack_fffffffffffffff2,uVar2)));
  return prVar1;
}

Assistant:

cdf(result_type x) const {
      const result_type n{static_cast<result_type>(P.n())};
      const result_type m{static_cast<result_type>(P.m())};
      return math::Beta_I(n * x / (m + n * x), result_type(1) / result_type(2) * n,
                          result_type(1) / result_type(2) * m);
    }